

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::Phi(PortalImageInfiniteLight *this,SampledWavelengths *lambda)

{
  Image *this_00;
  float fVar1;
  undefined1 auVar2 [16];
  RGB *pRVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  long lVar5;
  ulong uVar6;
  int c;
  int c_00;
  undefined1 auVar7 [16];
  Float FVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [56];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  undefined1 auVar14 [56];
  SampledSpectrum SVar15;
  Float duv_dw;
  Float local_ac;
  undefined1 local_a8 [8];
  undefined1 local_a0 [12];
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  long local_88;
  PortalImageInfiniteLight *local_80;
  SampledWavelengths *local_78;
  Tuple2<pbrt::Point2,_float> local_70;
  undefined1 local_68 [16];
  RGBSpectrum local_58;
  undefined1 auVar13 [64];
  
  TVar4 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  local_78 = lambda;
  if (TVar4.y < 1) {
    stack0xffffffffffffff68 = ZEXT816(0);
  }
  else {
    register0x00001200 = ZEXT816(0);
    this_00 = &this->image;
    lVar5 = 0;
    local_80 = this;
    do {
      local_88 = lVar5;
      if (0 < TVar4.x) {
        uVar6 = 0;
        local_68 = ZEXT416((uint)((float)(int)lVar5 + 0.5));
        do {
          local_a8._0_4_ = 0.0;
          local_a8._4_4_ = 0.0;
          local_a0._0_4_ = 0.0;
          c_00 = 0;
          do {
            FVar8 = Image::GetChannel(this_00,(Point2i)(lVar5 << 0x20 | uVar6),c_00,
                                      (WrapMode2D)0x200000002);
            this = local_80;
            pRVar3 = (RGB *)local_a8;
            if ((c_00 != 0) && (pRVar3 = (RGB *)(local_a8 + 4), c_00 != 1)) {
              pRVar3 = (RGB *)local_a0;
            }
            c_00 = c_00 + 1;
            pRVar3->r = FVar8;
          } while (c_00 != 3);
          auVar2 = vinsertps_avx(ZEXT416((uint)((float)(int)uVar6 + 0.5)),
                                 ZEXT416((uint)local_68._0_4_),0x10);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = (local_80->image).resolution.super_Tuple2<pbrt::Point2,_int>;
          auVar7 = vcvtdq2ps_avx(auVar7);
          auVar14 = ZEXT856(auVar7._8_8_);
          auVar7 = vdivps_avx(auVar2,auVar7);
          auVar11 = ZEXT856(auVar7._8_8_);
          local_70 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar7);
          RenderFromImage(local_80,(Point2f *)&local_70,&local_ac);
          RGBSpectrum::RGBSpectrum(&local_58,this->imageColorSpace,(RGB *)local_a8);
          SVar15 = RGBSpectrum::Sample(&local_58,local_78);
          auVar13._0_8_ = SVar15.values.values._8_8_;
          auVar13._8_56_ = auVar14;
          auVar10._0_8_ = SVar15.values.values._0_8_;
          auVar10._8_56_ = auVar11;
          auVar7 = vmovlhps_avx(auVar10._0_16_,auVar13._0_16_);
          auVar2._4_4_ = local_ac;
          auVar2._0_4_ = local_ac;
          auVar2._8_4_ = local_ac;
          auVar2._12_4_ = local_ac;
          auVar7 = vdivps_avx512vl(auVar7,auVar2);
          TVar4 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
          uVar6 = uVar6 + 1;
          local_a0._8_4_ = auVar7._0_4_ + (float)local_a0._8_4_;
          fStack_94 = auVar7._4_4_ + fStack_94;
          fStack_90 = auVar7._8_4_ + fStack_90;
          fStack_8c = auVar7._12_4_ + fStack_8c;
        } while ((long)uVar6 < (long)TVar4.x);
      }
      lVar5 = local_88 + 1;
    } while (lVar5 < (long)TVar4 >> 0x20);
  }
  fVar1 = this->scale;
  FVar8 = Area(this);
  fVar1 = FVar8 * fVar1;
  TVar4 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  auVar12._0_4_ = (float)(TVar4.x * TVar4.y);
  auVar9._0_4_ = fVar1 * (float)local_a0._8_4_;
  auVar9._4_4_ = fVar1 * fStack_94;
  auVar9._8_4_ = fVar1 * fStack_90;
  auVar9._12_4_ = fVar1 * fStack_8c;
  auVar12._4_4_ = auVar12._0_4_;
  auVar12._8_4_ = auVar12._0_4_;
  auVar12._12_4_ = auVar12._0_4_;
  auVar7 = vdivps_avx(auVar9,auVar12);
  auVar2 = vshufpd_avx(auVar7,auVar7,1);
  SVar15.values.values._0_8_ = auVar7._0_8_;
  SVar15.values.values._8_8_ = auVar2._0_8_;
  return (SampledSpectrum)SVar15.values.values;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::Phi(const SampledWavelengths &lambda) const {
    // We're really computing fluence, then converting to power, for what
    // that's worth..
    SampledSpectrum sumL(0.);

    for (int y = 0; y < image.Resolution().y; ++y) {
        for (int x = 0; x < image.Resolution().x; ++x) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({x, y}, c);

            Point2f st((x + 0.5f) / image.Resolution().x,
                       (y + 0.5f) / image.Resolution().y);
            Float duv_dw;
            (void)RenderFromImage(st, &duv_dw);

            sumL += RGBSpectrum(*imageColorSpace, rgb).Sample(lambda) / duv_dw;
        }
    }

    return scale * Area() * sumL / (image.Resolution().x * image.Resolution().y);
}